

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowDistinctAggregatorLocalState::Sorted(WindowDistinctAggregatorLocalState *this)

{
  GlobalSortStatePtr *this_00;
  DataChunk *chunk;
  WindowAggregator *pWVar1;
  ulong uVar2;
  value_type vVar3;
  int iVar4;
  Elements *this_01;
  type pGVar5;
  const_reference pvVar6;
  pointer pPVar7;
  reference pvVar8;
  pointer pGVar9;
  reference pvVar10;
  ulong uVar11;
  size_type __n;
  unsigned_long uVar12;
  size_type *psVar13;
  size_type sVar14;
  templated_unique_single_t scanner;
  SBIterator prev;
  SBIterator curr;
  SortLayout prefix_layout;
  
  this_00 = &this->gastate->global_sort;
  this_01 = MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
            ::LowestLevel(&this->gastate->zipped_tree);
  pWVar1 = (this->gastate->super_WindowAggregatorGlobalState).aggregator;
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator*(this_00);
  make_uniq<duckdb::PayloadScanner,duckdb::GlobalSortState&,unsigned_long&>
            ((duckdb *)&scanner,pGVar5,&this->block_idx);
  pvVar6 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      &this->gastate->block_starts,this->block_idx + 1);
  uVar2 = *pvVar6;
  pPVar7 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
           operator->(&scanner);
  chunk = &this->payload_chunk;
  PayloadScanner::Scan(pPVar7,chunk);
  pvVar8 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,0);
  psVar13 = (size_type *)pvVar8->data;
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator*(this_00);
  SBIterator::SBIterator(&curr,pGVar5,COMPARE_LESSTHAN,0);
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator*(this_00);
  SBIterator::SBIterator(&prev,pGVar5,COMPARE_LESSTHAN,0);
  pGVar9 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(this_00);
  SortLayout::GetPrefixComparisonLayout
            (&prefix_layout,&pGVar9->sort_layout,
             ((long)(pWVar1->arg_types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pWVar1->arg_types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18);
  pvVar6 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      &this->gastate->block_starts,this->block_idx);
  vVar3 = *pvVar6;
  if (vVar3 == 0) {
    __n = *psVar13;
    pvVar10 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::get<true>(this_01,__n);
    (pvVar10->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
    (pvVar10->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         __n;
    pvVar10 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::get<true>
                        (&this->gastate->seconds,this->block_idx);
    sVar14 = __n;
  }
  else {
    SBIterator::SetIndex(&curr,vVar3 - 1);
    SBIterator::SetIndex(&prev,vVar3 - 1);
    sVar14 = *psVar13;
    pvVar10 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::get<true>
                        (&this->gastate->seconds,this->block_idx);
    __n = 0;
  }
  uVar11 = (ulong)(vVar3 == 0);
  (pvVar10->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = sVar14;
  SBIterator::operator++(&curr);
  while (curr.entry_idx < uVar2) {
    if ((this->payload_chunk).count <= uVar11) {
      DataChunk::Reset(chunk);
      pPVar7 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
               ::operator->(&scanner);
      PayloadScanner::Scan(pPVar7,chunk);
      pvVar8 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,0);
      psVar13 = (size_type *)pvVar8->data;
      uVar11 = 0;
    }
    sVar14 = psVar13[uVar11];
    if (prefix_layout.all_constant == true) {
      iVar4 = FastMemcmp(prev.entry_ptr,curr.entry_ptr,prefix_layout.comparison_size);
    }
    else {
      iVar4 = Comparators::CompareTuple
                        (&prev.scan,&curr.scan,&prev.entry_ptr,&curr.entry_ptr,&prefix_layout,
                         &prev.external);
    }
    if (iVar4 == 0) {
      pvVar10 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::get<true>(this_01,sVar14);
      uVar12 = __n + 1;
    }
    else {
      pvVar10 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::get<true>(this_01,sVar14);
      uVar12 = 0;
    }
    (pvVar10->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar12;
    (pvVar10->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         sVar14;
    SBIterator::operator++(&curr);
    uVar11 = uVar11 + 1;
    SBIterator::operator++(&prev);
    __n = sVar14;
  }
  pvVar10 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::get<true>
                      (&this->gastate->seconds,this->block_idx);
  (pvVar10->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       __n;
  SortLayout::~SortLayout(&prefix_layout);
  SBScanState::~SBScanState(&prev.scan);
  SBScanState::~SBScanState(&curr.scan);
  ::std::unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
  ~unique_ptr(&scanner.
               super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
             );
  return;
}

Assistant:

void WindowDistinctAggregatorLocalState::Sorted() {
	using ZippedTuple = WindowDistinctAggregatorGlobalState::ZippedTuple;
	auto &global_sort = gastate.global_sort;
	auto &prev_idcs = gastate.zipped_tree.LowestLevel();
	auto &aggregator = gastate.aggregator;
	auto &scan_chunk = payload_chunk;

	auto scanner = make_uniq<PayloadScanner>(*global_sort, block_idx);
	const auto in_size = gastate.block_starts.at(block_idx + 1);
	scanner->Scan(scan_chunk);
	idx_t scan_idx = 0;

	auto *input_idx = FlatVector::GetData<idx_t>(scan_chunk.data[0]);
	idx_t i = 0;

	SBIterator curr(*global_sort, ExpressionType::COMPARE_LESSTHAN);
	SBIterator prev(*global_sort, ExpressionType::COMPARE_LESSTHAN);
	auto prefix_layout = global_sort->sort_layout.GetPrefixComparisonLayout(aggregator.arg_types.size());

	const auto block_begin = gastate.block_starts.at(block_idx);
	if (!block_begin) {
		// First block, so set up initial sentinel
		i = input_idx[scan_idx++];
		prev_idcs[i] = ZippedTuple(0, i);
		std::get<0>(gastate.seconds[block_idx]) = i;
	} else {
		// Move to the to end of the previous block
		// so we can record the comparison result for the first row
		curr.SetIndex(block_begin - 1);
		prev.SetIndex(block_begin - 1);
		scan_idx = 0;
		std::get<0>(gastate.seconds[block_idx]) = input_idx[scan_idx];
	}

	//	8:	for i ← 1 to in.size do
	for (++curr; curr.GetIndex() < in_size; ++curr, ++prev) {
		//	Scan second one chunk at a time
		//	Note the scan is one behind the iterators
		if (scan_idx >= scan_chunk.size()) {
			scan_chunk.Reset();
			scanner->Scan(scan_chunk);
			scan_idx = 0;
			input_idx = FlatVector::GetData<idx_t>(scan_chunk.data[0]);
		}
		auto second = i;
		i = input_idx[scan_idx++];

		int lt = 0;
		if (prefix_layout.all_constant) {
			lt = FastMemcmp(prev.entry_ptr, curr.entry_ptr, prefix_layout.comparison_size);
		} else {
			lt = Comparators::CompareTuple(prev.scan, curr.scan, prev.entry_ptr, curr.entry_ptr, prefix_layout,
			                               prev.external);
		}

		//	9:	if sorted[i].first == sorted[i-1].first then
		//	10:		prevIdcs[i] ← sorted[i-1].second
		//	11:	else
		//	12:		prevIdcs[i] ← “-”
		if (!lt) {
			prev_idcs[i] = ZippedTuple(second + 1, i);
		} else {
			prev_idcs[i] = ZippedTuple(0, i);
		}
	}

	// Save the last value of i for patching up the block boundaries
	std::get<1>(gastate.seconds[block_idx]) = i;
}